

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t * roaring_bitmap_flip(roaring_bitmap_t *x1,uint64_t range_start,uint64_t range_end)

{
  ushort uVar1;
  uint16_t *puVar2;
  rle16_t *prVar3;
  _Bool _Var4;
  uint8_t uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  roaring_array_t *ra;
  roaring_bitmap_t *prVar9;
  run_container_t *c;
  uint16_t hb;
  uint8_t uVar10;
  uint uVar11;
  uint64_t uVar12;
  ulong uVar13;
  uint uVar14;
  run_container_t *run;
  uint16_t lb_start;
  uint uVar15;
  uint uVar16;
  array_container_t *src;
  ushort uVar17;
  bool bVar18;
  run_container_t *local_48;
  ulong local_40;
  uint local_34;
  
  if (range_end <= range_start) {
    prVar9 = roaring_bitmap_copy(x1);
    return prVar9;
  }
  uVar12 = 0x100000000;
  if (range_end < 0x100000000) {
    uVar12 = range_end;
  }
  ra = &roaring_bitmap_create_with_capacity(0)->high_low_container;
  ra->flags = ra->flags & 0xfe | (x1->high_low_container).flags & 1;
  uVar13 = uVar12 - 1;
  hb = (uint16_t)(uVar13 >> 0x10);
  uVar17 = (ushort)(range_start >> 0x10);
  local_40 = uVar13;
  ra_append_copies_until
            (ra,&x1->high_low_container,uVar17,(_Bool)((x1->high_low_container).flags & 1));
  lb_start = (uint16_t)range_start;
  if (hb == uVar17) {
    insert_flipped_container(ra,&x1->high_low_container,uVar17,lb_start,(uint16_t)uVar13);
  }
  else {
    if (lb_start != 0) {
      insert_flipped_container(ra,&x1->high_low_container,uVar17,lb_start,0xffff);
      uVar17 = uVar17 + 1;
    }
    local_40 = local_40 & 0xffff;
    uVar11 = ((uint)(uVar13 >> 0x10) & 0xffff) - (uint)(local_40 != 0xffff);
    hb = (uint16_t)uVar11;
    if (uVar17 <= hb) {
      local_34 = uVar11 & 0xffff;
      uVar11 = (uint)uVar17;
      do {
        iVar8 = (x1->high_low_container).size;
        uVar17 = (ushort)uVar11;
        if (((long)iVar8 == 0) ||
           (puVar2 = (x1->high_low_container).keys, puVar2[(long)iVar8 + -1] == uVar17)) {
          uVar6 = iVar8 - 1;
        }
        else {
          uVar7 = iVar8 - 1;
          uVar14 = 0;
          uVar15 = uVar7;
          do {
            if ((int)uVar7 < (int)uVar14) {
              uVar6 = ~uVar14;
              break;
            }
            uVar6 = uVar14 + uVar7 >> 1;
            uVar1 = *(ushort *)((long)puVar2 + (ulong)(uVar14 + uVar7 & 0xfffffffe));
            if (uVar1 < uVar17) {
              uVar14 = uVar6 + 1;
              bVar18 = true;
              uVar6 = uVar15;
            }
            else if (uVar17 < uVar1) {
              uVar7 = uVar6 - 1;
              bVar18 = true;
              uVar6 = uVar15;
            }
            else {
              bVar18 = false;
            }
            uVar15 = uVar6;
          } while (bVar18);
        }
        iVar8 = ra->size;
        if (((long)iVar8 == 0) || (ra->keys[(long)iVar8 + -1] == uVar17)) {
          uVar15 = iVar8 - 1;
        }
        else {
          uVar16 = iVar8 - 1;
          uVar14 = 0;
          uVar7 = uVar16;
          do {
            if ((int)uVar16 < (int)uVar14) {
              uVar15 = ~uVar14;
              break;
            }
            uVar15 = uVar14 + uVar16 >> 1;
            uVar1 = *(ushort *)((long)ra->keys + (ulong)(uVar14 + uVar16 & 0xfffffffe));
            if (uVar1 < uVar17) {
              uVar14 = uVar15 + 1;
              bVar18 = true;
              uVar15 = uVar7;
            }
            else if (uVar17 < uVar1) {
              uVar16 = uVar15 - 1;
              bVar18 = true;
              uVar15 = uVar7;
            }
            else {
              bVar18 = false;
            }
            uVar7 = uVar15;
          } while (bVar18);
        }
        if ((int)uVar6 < 0) {
          c = run_container_create_given_capacity(1);
          if (c != (run_container_t *)0x0) {
            prVar3 = c->runs;
            iVar8 = c->n_runs;
            prVar3[iVar8].value = 0;
            prVar3[iVar8].length = 0xffff;
            c->n_runs = c->n_runs + 1;
          }
          uVar10 = '\x03';
LAB_00108e20:
          ra_insert_new_key_value_at(ra,~uVar15,uVar17,c,uVar10);
        }
        else {
          uVar10 = (x1->high_low_container).typecodes[uVar6 & 0xffff];
          src = (array_container_t *)(x1->high_low_container).containers[uVar6 & 0xffff];
          if (uVar10 == '\x04') {
            uVar10 = *(uint8_t *)&src->array;
            src = *(array_container_t **)src;
          }
          local_48 = (run_container_t *)0x0;
          if (uVar10 == '\x03') {
            iVar8 = run_container_negation((run_container_t *)src,&local_48);
            uVar10 = (uint8_t)iVar8;
          }
          else if (uVar10 == '\x02') {
            local_48 = (run_container_t *)bitset_container_create();
            array_container_negation(src,(bitset_container_t *)local_48);
            uVar10 = '\x01';
          }
          else {
            _Var4 = bitset_container_negation((bitset_container_t *)src,&local_48);
            uVar10 = '\x02' - _Var4;
          }
          c = local_48;
          run = local_48;
          uVar5 = uVar10;
          if (uVar10 == '\x04') {
            uVar5 = *(uint8_t *)&local_48->runs;
            run = *(run_container_t **)local_48;
          }
          if (uVar5 == '\x03') {
            iVar8 = run_container_cardinality(run);
          }
          else {
            iVar8 = run->n_runs;
          }
          if (iVar8 != 0) goto LAB_00108e20;
          container_free(c,uVar10);
        }
        bVar18 = uVar11 != local_34;
        uVar11 = uVar11 + 1;
      } while (bVar18);
    }
    if ((int)local_40 != 0xffff) {
      hb = hb + 1;
      insert_flipped_container(ra,&x1->high_low_container,hb,0,(uint16_t)uVar13);
    }
  }
  ra_append_copies_after(ra,&x1->high_low_container,hb,(_Bool)((x1->high_low_container).flags & 1));
  return (roaring_bitmap_t *)ra;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_flip(const roaring_bitmap_t *x1,
                                      uint64_t range_start,
                                      uint64_t range_end) {
    if (range_start >= range_end) {
        return roaring_bitmap_copy(x1);
    }
    if (range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }

    roaring_bitmap_t *ans = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(ans, is_cow(x1));

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;  // & 0xFFFF;
    uint16_t hb_end = (uint16_t)((range_end - 1) >> 16);
    const uint16_t lb_end = (uint16_t)(range_end - 1);  // & 0xFFFF;

    ra_append_copies_until(&ans->high_low_container, &x1->high_low_container,
                           hb_start, is_cow(x1));
    if (hb_start == hb_end) {
        insert_flipped_container(&ans->high_low_container,
                                 &x1->high_low_container, hb_start, lb_start,
                                 lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_start,
                                     lb_start, 0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;  // later we'll handle the partial block

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            insert_fully_flipped_container(&ans->high_low_container,
                                           &x1->high_low_container,
                                           (uint16_t)hb);
        }

        // handle a partial final container
        if (lb_end != 0xFFFF) {
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_end + 1, 0,
                                     lb_end);
            ++hb_end;
        }
    }
    ra_append_copies_after(&ans->high_low_container, &x1->high_low_container,
                           hb_end, is_cow(x1));
    return ans;
}